

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O0

int __thiscall GEO::geofile::merge_points(geofile *this,geofile *secondary_file)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  iterator __x;
  pointer ppVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_int>_>,_bool> pVar5;
  pair<const_int,_GEO::point> local_128;
  _Self local_100;
  iterator sec_point_map_it_1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> local_f0;
  _Base_ptr local_c0;
  _Base_ptr local_b8;
  undefined1 local_b0;
  int local_94;
  pair<const_int,_int> local_90;
  _Self local_88;
  iterator sec_point_map_it;
  iterator sec_point_map_end;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> changes;
  int delta;
  _Rb_tree_iterator<std::pair<const_int,_GEO::point>_> local_38;
  int local_2c;
  iterator iStack_28;
  int highest_primary;
  int local_1c;
  geofile *pgStack_18;
  int lowest_secondary;
  geofile *secondary_file_local;
  geofile *this_local;
  
  pgStack_18 = secondary_file;
  secondary_file_local = this;
  bVar1 = std::
          map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>::
          empty(&this->points_map);
  if (bVar1) {
    std::map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>::
    operator=(&this->points_map,&pgStack_18->points_map);
  }
  else {
    iStack_28 = std::
                map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
                ::begin(&pgStack_18->points_map);
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_GEO::point>_>::operator->
                       (&stack0xffffffffffffffd8);
    local_1c = ppVar3->first;
    __x = std::
          map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>::
          end(&this->points_map);
    local_38 = std::prev<std::_Rb_tree_iterator<std::pair<int_const,GEO::point>>>(__x._M_node,1);
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_GEO::point>_>::operator->(&local_38);
    local_2c = ppVar3->first;
    iVar2 = local_2c - local_1c;
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               &sec_point_map_end);
    sec_point_map_it =
         std::
         map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>::
         end(&pgStack_18->points_map);
    local_88._M_node =
         (_Base_ptr)
         std::
         map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>::
         begin(&pgStack_18->points_map);
    while( true ) {
      bVar1 = std::operator!=(&local_88,&sec_point_map_it);
      if (!bVar1) break;
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_GEO::point>_>::operator->(&local_88);
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_GEO::point>_>::operator->(&local_88);
      local_94 = ppVar4->first + iVar2 + 1;
      std::pair<const_int,_int>::pair<int,_true>(&local_90,&ppVar3->first,&local_94);
      pVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
              insert((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     &sec_point_map_end,&local_90);
      local_b8 = (_Base_ptr)pVar5.first._M_node;
      local_b0 = pVar5.second;
      local_c0 = (_Base_ptr)
                 std::_Rb_tree_iterator<std::pair<const_int,_GEO::point>_>::operator++(&local_88,0);
    }
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
              (&local_f0,
               (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               &sec_point_map_end);
    adjust_points(this,&local_f0);
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map(&local_f0)
    ;
    sec_point_map_it_1 =
         std::
         map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>::
         end(&pgStack_18->points_map);
    sec_point_map_it._M_node = sec_point_map_it_1._M_node;
    local_100._M_node =
         (_Base_ptr)
         std::
         map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>::
         begin(&pgStack_18->points_map);
    while( true ) {
      bVar1 = std::operator!=(&local_100,&sec_point_map_it);
      if (!bVar1) break;
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_GEO::point>_>::operator->(&local_100);
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_GEO::point>_>::operator->(&local_100);
      std::pair<const_int,_GEO::point>::pair<GEO::point_&,_true>
                (&local_128,&ppVar3->first,&ppVar4->second);
      std::map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
      ::insert(&this->points_map,&local_128);
      std::_Rb_tree_iterator<std::pair<const_int,_GEO::point>_>::operator++(&local_100,0);
    }
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               &sec_point_map_end);
  }
  return 0;
}

Assistant:

int GEO::geofile::merge_points(geofile &secondary_file)
{
    if (!points_map.empty())
    {
        int lowest_secondary    = secondary_file.points_map.begin()->first;
        int highest_primary     = std::prev(points_map.end())->first;
        int delta               = highest_primary - lowest_secondary + 1;
        std::map <int,int> changes;
        auto sec_point_map_end = secondary_file.points_map.end();
        for (   auto sec_point_map_it = secondary_file.points_map.begin();
                sec_point_map_it != sec_point_map_end;
                sec_point_map_it++)
        {
            changes.insert({ sec_point_map_it->first,
                            sec_point_map_it->first + delta});
        }
        adjust_points(changes);
        sec_point_map_end = secondary_file.points_map.end();
        for (   auto sec_point_map_it = secondary_file.points_map.begin();
                sec_point_map_it != sec_point_map_end;
                sec_point_map_it++)
        {
            points_map.insert({sec_point_map_it->first,sec_point_map_it->second});
        }
    }
    else
    {
        points_map = secondary_file.points_map;
    }
    return EXIT_SUCCESS;
}